

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaLinCon.cpp
# Opt level: O3

char * LinControlKindToStrIO(NaLinearControlKind eK)

{
  if (eK < __lckNumber) {
    return *(char **)(&DAT_00174568 + (ulong)eK * 8);
  }
  return "???";
}

Assistant:

const char*
LinControlKindToStrIO (NaLinearControlKind eK)
{
    switch(eK){
    case lckGain:
        return "gain";
    case lckInertial:
        return "inertial";
    case lckIntegral:
        return "integral";
    case lckDifferential:
        return "differential";
    case lckDiffStatic:
        return "diffstatic";
    case lckOscillation:
        return "oscillation";
    case lckConservative:
        return "conservative";
    case lckDelay:
        return "delay";
    }
    return "???";
}